

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cc
# Opt level: O2

uint AddBodyFixedJoint(Model *model,uint parent_id,SpatialTransform *joint_frame,Joint *joint,
                      Body *body,string *body_name)

{
  SpatialTransform *this;
  pointer pFVar1;
  pointer pSVar2;
  pointer pFVar3;
  bool bVar4;
  pointer pBVar5;
  ulong uVar6;
  iterator iVar7;
  mapped_type *pmVar8;
  ostream *poVar9;
  RBDLError *pRVar10;
  long lVar11;
  long lVar12;
  SpatialTransform *pSVar13;
  Body *pBVar14;
  Matrix3d *pMVar15;
  SpatialTransform *pSVar16;
  SpatialTransform *pSVar17;
  Matrix3d *pMVar18;
  uint uVar19;
  byte bVar20;
  string local_388;
  string local_368;
  Body parent_body;
  FixedBody fixed_parent;
  FixedBody fbody;
  
  bVar20 = 0;
  RigidBodyDynamics::FixedBody::CreateFromBody(&fbody,body);
  this = &fbody.mParentTransform;
  fbody.mMovableParent = parent_id;
  RigidBodyDynamics::Math::SpatialTransform::operator=(this,joint_frame);
  bVar4 = RigidBodyDynamics::Model::IsFixedBodyId(model,parent_id);
  if (bVar4) {
    uVar19 = parent_id - model->fixed_body_discriminator;
    pFVar1 = (model->mFixedBodies).
             super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             .
             super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pFVar3 = pFVar1 + uVar19;
    fixed_parent.mMass = pFVar3->mMass;
    fixed_parent.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)
          &(pFVar3->mCenterOfMass).super_Vector3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
    fixed_parent.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)((long)&(pFVar3->mCenterOfMass).super_Vector3d + 8);
    fixed_parent.mCenterOfMass.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)((long)&(pFVar3->mCenterOfMass).super_Vector3d + 0x10);
    lVar12 = 9;
    pMVar15 = &pFVar3->mInertia;
    pMVar18 = &fixed_parent.mInertia;
    for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pMVar18->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           *(double *)
            &(pMVar15->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
      pMVar15 = (Matrix3d *)((long)pMVar15 + ((ulong)bVar20 * -2 + 1) * 8);
      pMVar18 = (Matrix3d *)((long)pMVar18 + (ulong)bVar20 * -0x10 + 8);
    }
    fixed_parent.mMovableParent = pFVar3->mMovableParent;
    pSVar17 = &pFVar1[uVar19].mParentTransform;
    pSVar13 = pSVar17;
    pSVar16 = &fixed_parent.mParentTransform;
    for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pSVar16->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&pSVar13->E;
      pSVar13 = (SpatialTransform *)((long)pSVar13 + ((ulong)bVar20 * -2 + 1) * 8);
      pSVar16 = (SpatialTransform *)((long)pSVar16 + (ulong)bVar20 * -0x10 + 8);
    }
    fixed_parent.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)((long)&pSVar17->r + 0x10);
    fixed_parent.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)&(pSVar17->r).super_Vector3d;
    fixed_parent.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)((long)&pSVar17->r + 8);
    pSVar13 = &pFVar1[uVar19].mBaseTransform;
    pSVar16 = &fixed_parent.mBaseTransform;
    for (lVar11 = lVar12; lVar11 != 0; lVar11 = lVar11 + -1) {
      (pSVar16->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] = *(double *)&pSVar13->E;
      pSVar13 = (SpatialTransform *)((long)pSVar13 + ((ulong)bVar20 * -2 + 1) * 8);
      pSVar16 = (SpatialTransform *)((long)pSVar16 + (ulong)bVar20 * -0x10 + 8);
    }
    fixed_parent.mBaseTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         *(double *)((long)(pSVar17 + 1) + 0x58);
    fixed_parent.mBaseTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         *(double *)&((Vector3d *)((long)(pSVar17 + 1) + 0x48))->super_Vector3d;
    fixed_parent.mBaseTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         *(double *)((long)(pSVar17 + 1) + 0x50);
    fbody.mMovableParent = fixed_parent.mMovableParent;
    RigidBodyDynamics::Math::SpatialTransform::operator*
              ((SpatialTransform *)&parent_body,joint_frame,&fixed_parent.mParentTransform);
    pBVar14 = &parent_body;
    pSVar17 = this;
    for (; lVar12 != 0; lVar12 = lVar12 + -1) {
      (pSVar17->E).super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
      m_storage.m_data.array[0] =
           (((Matrix3d *)&pBVar14->mMass)->super_Matrix3d).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
      pBVar14 = (Body *)((long)pBVar14 + (ulong)bVar20 * -0x10 + 8);
      pSVar17 = (SpatialTransform *)((long)pSVar17 + (ulong)bVar20 * -0x10 + 8);
    }
    fbody.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         parent_body.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7];
    fbody.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
         parent_body.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5];
    fbody.mParentTransform.r.super_Vector3d.
    super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
         parent_body.mInertia.super_Matrix3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6];
  }
  pBVar5 = (model->mBodies).
           super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
           .
           super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
           ._M_impl.super__Vector_impl_data._M_start + fbody.mMovableParent;
  parent_body.mMass = pBVar5->mMass;
  parent_body.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       *(double *)
        &(pBVar5->mCenterOfMass).super_Vector3d.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
  parent_body.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       *(double *)((long)&(pBVar5->mCenterOfMass).super_Vector3d + 8);
  parent_body.mCenterOfMass.super_Vector3d.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       *(double *)((long)&(pBVar5->mCenterOfMass).super_Vector3d + 0x10);
  pMVar15 = &pBVar5->mInertia;
  pMVar18 = &parent_body.mInertia;
  for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
    (pMVar18->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
    .m_data.array[0] =
         *(double *)
          &(pMVar15->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>;
    pMVar15 = (Matrix3d *)((long)pMVar15 + ((ulong)bVar20 * -2 + 1) * 8);
    pMVar18 = (Matrix3d *)((long)pMVar18 + (ulong)bVar20 * -0x10 + 8);
  }
  parent_body.mIsVirtual = pBVar5->mIsVirtual;
  RigidBodyDynamics::Body::Join(&parent_body,this,body);
  RigidBodyDynamics::Body::operator=
            ((model->mBodies).
             super_vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             .
             super__Vector_base<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
             ._M_impl.super__Vector_impl_data._M_start + fbody.mMovableParent,&parent_body);
  RigidBodyDynamics::Math::SpatialRigidBodyInertia::createFromMassComInertiaC
            ((SpatialRigidBodyInertia *)&fixed_parent,parent_body.mMass,&parent_body.mCenterOfMass,
             &parent_body.mInertia);
  uVar6 = (ulong)fbody.mMovableParent;
  pSVar2 = (model->I).
           super_vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
           .
           super__Vector_base<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar2[uVar6].m = fixed_parent.mMass;
  *(double *)&pSVar2[uVar6].h.super_Vector3d =
       fixed_parent.mCenterOfMass.super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  *(double *)((long)&pSVar2[uVar6].h.super_Vector3d + 8) =
       fixed_parent.mCenterOfMass.super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  *(double *)((long)&pSVar2[uVar6].h.super_Vector3d + 0x10) =
       fixed_parent.mCenterOfMass.super_Vector3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  pSVar2[uVar6].Ixx =
       fixed_parent.mInertia.super_Matrix3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0];
  (&pSVar2[uVar6].Ixx)[1] =
       fixed_parent.mInertia.super_Matrix3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1];
  pSVar2[uVar6].Iyy =
       fixed_parent.mInertia.super_Matrix3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2];
  (&pSVar2[uVar6].Iyy)[1] =
       fixed_parent.mInertia.super_Matrix3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3];
  pSVar2[uVar6].Izy =
       fixed_parent.mInertia.super_Matrix3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4];
  (&pSVar2[uVar6].Izy)[1] =
       fixed_parent.mInertia.super_Matrix3d.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5];
  std::vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
  ::push_back(&(model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
              ,&fbody);
  uVar6 = ((long)(model->mFixedBodies).
                 super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 .
                 super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(model->mFixedBodies).
                super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                .
                super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x130;
  uVar19 = model->fixed_body_discriminator;
  if (uVar6 <= ~uVar19) {
    if (body_name->_M_string_length != 0) {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
              ::find(&(model->mBodyNameMap)._M_t,body_name);
      if ((_Rb_tree_header *)iVar7._M_node !=
          &(model->mBodyNameMap)._M_t._M_impl.super__Rb_tree_header) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&fixed_parent);
        poVar9 = std::operator<<((ostream *)&fixed_parent,"Error: Body with name \'");
        poVar9 = std::operator<<(poVar9,(string *)body_name);
        poVar9 = std::operator<<(poVar9,"\' already exists!");
        std::endl<char,std::char_traits<char>>(poVar9);
        pRVar10 = (RBDLError *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        RigidBodyDynamics::Errors::RBDLError::RBDLError(pRVar10,&local_388);
        __cxa_throw(pRVar10,&RigidBodyDynamics::Errors::RBDLError::typeinfo,
                    RigidBodyDynamics::Errors::RBDLError::~RBDLError);
      }
      pFVar3 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pFVar1 = (model->mFixedBodies).
               super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               .
               super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar19 = model->fixed_body_discriminator;
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               ::operator[](&model->mBodyNameMap,body_name);
      *pmVar8 = ((int)(((long)pFVar3 - (long)pFVar1) / 0x130) + uVar19) - 1;
      uVar19 = model->fixed_body_discriminator;
      uVar6 = ((long)(model->mFixedBodies).
                     super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     .
                     super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(model->mFixedBodies).
                    super_vector<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    .
                    super__Vector_base<RigidBodyDynamics::FixedBody,_Eigen::aligned_allocator<RigidBodyDynamics::FixedBody>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x130;
    }
    return ((int)uVar6 + uVar19) - 1;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&fixed_parent);
  poVar9 = std::operator<<((ostream *)&fixed_parent,"Error: cannot add more than ");
  poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
  poVar9 = std::operator<<(poVar9," fixed bodies. You need to modify ");
  poVar9 = std::operator<<(poVar9,"Model::fixed_body_discriminator for this.");
  std::endl<char,std::char_traits<char>>(poVar9);
  pRVar10 = (RBDLError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  RigidBodyDynamics::Errors::RBDLError::RBDLError(pRVar10,&local_368);
  __cxa_throw(pRVar10,&RigidBodyDynamics::Errors::RBDLError::typeinfo,
              RigidBodyDynamics::Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int AddBodyFixedJoint (
  Model &model,
  const unsigned int parent_id,
  const SpatialTransform &joint_frame,
  const Joint &joint,
  const Body &body,
  std::string body_name)
{
  FixedBody fbody = FixedBody::CreateFromBody (body);
  fbody.mMovableParent = parent_id;
  fbody.mParentTransform = joint_frame;

  if (model.IsFixedBodyId(parent_id)) {
    FixedBody fixed_parent =
      model.mFixedBodies[parent_id - model.fixed_body_discriminator];

    fbody.mMovableParent = fixed_parent.mMovableParent;
    fbody.mParentTransform = joint_frame * fixed_parent.mParentTransform;
  }

  // merge the two bodies
  Body parent_body = model.mBodies[fbody.mMovableParent];
  parent_body.Join (fbody.mParentTransform, body);
  model.mBodies[fbody.mMovableParent] = parent_body;
  model.I[fbody.mMovableParent] =
    SpatialRigidBodyInertia::createFromMassComInertiaC (
      parent_body.mMass,
      parent_body.mCenterOfMass,
      parent_body.mInertia);

  model.mFixedBodies.push_back (fbody);

  if (model.mFixedBodies.size() > std::numeric_limits<unsigned int>::max() -
      model.fixed_body_discriminator) {
    std::ostringstream errormsg;
    errormsg  << "Error: cannot add more than "
              << std::numeric_limits<unsigned int>::max() - model.mFixedBodies.size()
              << " fixed bodies. You need to modify "
              << "Model::fixed_body_discriminator for this."
              << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  if (body_name.size() != 0) {
    if (model.mBodyNameMap.find(body_name) != model.mBodyNameMap.end()) {
      std::ostringstream errormsg;
      errormsg << "Error: Body with name '"
               << body_name
               << "' already exists!"
               << std::endl;
      throw Errors::RBDLError(errormsg.str());
    }
    model.mBodyNameMap[body_name] = model.mFixedBodies.size()
                                    + model.fixed_body_discriminator - 1;
  }

  return model.mFixedBodies.size() + model.fixed_body_discriminator - 1;
}